

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldUnittest.cpp
# Opt level: O0

void __thiscall FieldUnittest_Register_Test::TestBody(FieldUnittest_Register_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DataFieldInfo *pDVar4;
  string *psVar5;
  Serializer *serializer;
  AssertHelper local_1680;
  Message local_1678;
  int local_166c;
  undefined1 local_1668 [8];
  AssertionResult gtest_ar_118;
  Message local_1650;
  int local_1644;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_117;
  Message local_1628;
  int local_161c;
  undefined1 local_1618 [8];
  AssertionResult gtest_ar_116;
  Message local_1600;
  int local_15f4;
  undefined1 local_15f0 [8];
  AssertionResult gtest_ar_115;
  Message local_15d8;
  int local_15cc;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar_114;
  Message local_15b0;
  int local_15a4;
  undefined1 local_15a0 [8];
  AssertionResult gtest_ar_113;
  Message local_1588;
  int local_157c;
  undefined1 local_1578 [8];
  AssertionResult gtest_ar_112;
  Message local_1560;
  int local_1554;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar_111;
  Message local_1538;
  int local_152c;
  undefined1 local_1528 [8];
  AssertionResult gtest_ar_110;
  Message local_1510;
  int local_1504;
  undefined1 local_1500 [8];
  AssertionResult gtest_ar_109;
  Message local_14e8;
  int local_14dc;
  undefined1 local_14d8 [8];
  AssertionResult gtest_ar_108;
  Message local_14c0;
  int local_14b4;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar_107;
  Message local_1498;
  int local_148c;
  undefined1 local_1488 [8];
  AssertionResult gtest_ar_106;
  Message local_1470;
  int local_1464;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar_105;
  Message local_1448;
  int local_143c;
  undefined1 local_1438 [8];
  AssertionResult gtest_ar_104;
  Message local_1420;
  int local_1414;
  undefined1 local_1410 [8];
  AssertionResult gtest_ar_103;
  Message local_13f8;
  int local_13ec;
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar_102;
  Message local_13d0;
  int local_13c4;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar_101;
  Message local_13a8;
  int local_139c;
  undefined1 local_1398 [8];
  AssertionResult gtest_ar_100;
  Message local_1380;
  int local_1374;
  undefined1 local_1370 [8];
  AssertionResult gtest_ar_99;
  Message local_1358;
  int local_134c;
  undefined1 local_1348 [8];
  AssertionResult gtest_ar_98;
  Message local_1330;
  int local_1324;
  undefined1 local_1320 [8];
  AssertionResult gtest_ar_97;
  Message local_1308;
  int local_12fc;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar_96;
  Message local_12e0;
  int local_12d4;
  undefined1 local_12d0 [8];
  AssertionResult gtest_ar_95;
  Message local_12b8;
  int local_12ac;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar_94;
  Message local_1290;
  int local_1284;
  undefined1 local_1280 [8];
  AssertionResult gtest_ar_93;
  Message local_1268;
  int local_125c;
  undefined1 local_1258 [8];
  AssertionResult gtest_ar_92;
  Message local_1240;
  int local_1234;
  undefined1 local_1230 [8];
  AssertionResult gtest_ar_91;
  Message local_1218;
  int local_120c;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_90;
  Message local_11f0;
  int local_11e4;
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_89;
  Message local_11c8;
  int local_11bc;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar_88;
  Message local_11a0;
  int local_1194;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_87;
  Message local_1178;
  int local_116c;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar_86;
  Message local_1150;
  int local_1144;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar_85;
  Message local_1128;
  int local_111c;
  undefined1 local_1118 [8];
  AssertionResult gtest_ar_84;
  Message local_1100;
  int local_10f4;
  undefined1 local_10f0 [8];
  AssertionResult gtest_ar_83;
  Message local_10d8;
  int local_10cc;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar_82;
  Message local_10b0;
  int local_10a4;
  undefined1 local_10a0 [8];
  AssertionResult gtest_ar_81;
  Message local_1088;
  int local_107c;
  undefined1 local_1078 [8];
  AssertionResult gtest_ar_80;
  Message local_1060;
  int local_1054;
  undefined1 local_1050 [8];
  AssertionResult gtest_ar_79;
  Message local_1038;
  int local_102c;
  undefined1 local_1028 [8];
  AssertionResult gtest_ar_78;
  Message local_1010;
  int local_1004;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_77;
  Message local_fe8;
  int local_fdc;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar_76;
  Message local_fc0;
  int local_fb4;
  undefined1 local_fb0 [8];
  AssertionResult gtest_ar_75;
  Message local_f98;
  int local_f8c;
  undefined1 local_f88 [8];
  AssertionResult gtest_ar_74;
  Message local_f70;
  int local_f64;
  undefined1 local_f60 [8];
  AssertionResult gtest_ar_73;
  Message local_f48;
  int local_f3c;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar_72;
  Message local_f20;
  int local_f14;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar_71;
  Message local_ef8;
  int local_eec;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar_70;
  Message local_ed0;
  int local_ec4;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar_69;
  Message local_ea8;
  int local_e9c;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_68;
  Message local_e80;
  int local_e74;
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_67;
  int local_e58;
  int lPlusHaloSize;
  int lMinusHaloSize;
  int kPlusHaloSize;
  int kMinusHaloSize;
  int jPlusHaloSize;
  int jMinusHaloSize;
  int iPlusHaloSize;
  int iMinusHaloSize;
  int lSize;
  int kSize;
  int jSize;
  int iSize;
  int bytesPerElement;
  Message local_e20;
  int local_e18 [2];
  undefined1 local_e10 [8];
  AssertionResult gtest_ar_66;
  Message local_df8;
  int local_df0 [2];
  undefined1 local_de8 [8];
  AssertionResult gtest_ar_65;
  Message local_dd0;
  int local_dc8 [2];
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_64;
  Message local_da8;
  int local_da0 [2];
  undefined1 local_d98 [8];
  AssertionResult gtest_ar_63;
  Message local_d80;
  int local_d78 [2];
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_62;
  Message local_d58;
  int local_d50 [2];
  undefined1 local_d48 [8];
  AssertionResult gtest_ar_61;
  Message local_d30;
  int local_d28 [2];
  undefined1 local_d20 [8];
  AssertionResult gtest_ar_60;
  Message local_d08;
  int local_d00 [2];
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_59;
  Message local_ce0;
  int local_cd8 [2];
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_58;
  Message local_cb8;
  int local_cb0 [2];
  undefined1 local_ca8 [8];
  AssertionResult gtest_ar_57;
  Message local_c90;
  int local_c88 [2];
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_56;
  Message local_c68;
  int local_c60 [2];
  undefined1 local_c58 [8];
  AssertionResult gtest_ar_55;
  Message local_c40;
  int local_c38 [2];
  undefined1 local_c30 [8];
  AssertionResult gtest_ar_54;
  Message local_c18;
  int local_c10 [2];
  undefined1 local_c08 [8];
  AssertionResult gtest_ar_53;
  Message local_bf0;
  allocator local_be1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_52;
  Message local_ba8;
  allocator local_b99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_51;
  string local_b60;
  DataFieldInfo *local_b40;
  DataFieldInfo *field4;
  Message local_b30;
  int local_b28 [2];
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_50;
  Message local_b08;
  int local_b00 [2];
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_49;
  Message local_ae0;
  int local_ad8 [2];
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_48;
  Message local_ab8;
  int local_ab0 [2];
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar_47;
  Message local_a90;
  int local_a88 [2];
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_46;
  Message local_a68;
  int local_a60 [2];
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_45;
  Message local_a40;
  int local_a38 [2];
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_44;
  Message local_a18;
  int local_a10 [2];
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_43;
  Message local_9f0;
  int local_9e8 [2];
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_42;
  Message local_9c8;
  int local_9c0 [2];
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_41;
  Message local_9a0;
  int local_998 [2];
  undefined1 local_990 [8];
  AssertionResult gtest_ar_40;
  Message local_978;
  int local_970 [2];
  undefined1 local_968 [8];
  AssertionResult gtest_ar_39;
  Message local_950;
  int local_948 [2];
  undefined1 local_940 [8];
  AssertionResult gtest_ar_38;
  Message local_928;
  int local_920 [2];
  undefined1 local_918 [8];
  AssertionResult gtest_ar_37;
  Message local_900;
  allocator local_8f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_36;
  Message local_8b8;
  allocator local_8a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_35;
  string local_870;
  DataFieldInfo *local_850;
  DataFieldInfo *field3;
  Message local_840;
  int local_838 [2];
  undefined1 local_830 [8];
  AssertionResult gtest_ar_34;
  Message local_818;
  int local_810 [2];
  undefined1 local_808 [8];
  AssertionResult gtest_ar_33;
  Message local_7f0;
  int local_7e8 [2];
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_32;
  Message local_7c8;
  int local_7c0 [2];
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_31;
  Message local_7a0;
  int local_798 [2];
  undefined1 local_790 [8];
  AssertionResult gtest_ar_30;
  Message local_778;
  int local_770 [2];
  undefined1 local_768 [8];
  AssertionResult gtest_ar_29;
  Message local_750;
  int local_748 [2];
  undefined1 local_740 [8];
  AssertionResult gtest_ar_28;
  Message local_728;
  int local_720 [2];
  undefined1 local_718 [8];
  AssertionResult gtest_ar_27;
  Message local_700;
  int local_6f8 [2];
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_26;
  Message local_6d8;
  int local_6d0 [2];
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_25;
  Message local_6b0;
  int local_6a8 [2];
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_24;
  Message local_688;
  int local_680 [2];
  undefined1 local_678 [8];
  AssertionResult gtest_ar_23;
  Message local_660;
  int local_658 [2];
  undefined1 local_650 [8];
  AssertionResult gtest_ar_22;
  Message local_638;
  int local_630 [2];
  undefined1 local_628 [8];
  AssertionResult gtest_ar_21;
  Message local_610;
  allocator local_601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_20;
  Message local_5c8;
  allocator local_5b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_19;
  string local_580;
  DataFieldInfo *local_560;
  DataFieldInfo *field2;
  Message local_550;
  int local_548 [2];
  undefined1 local_540 [8];
  AssertionResult gtest_ar_18;
  Message local_528;
  int local_520 [2];
  undefined1 local_518 [8];
  AssertionResult gtest_ar_17;
  Message local_500;
  int local_4f8 [2];
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_16;
  Message local_4d8;
  int local_4d0 [2];
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_15;
  Message local_4b0;
  int local_4a8 [2];
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_14;
  Message local_488;
  int local_480 [2];
  undefined1 local_478 [8];
  AssertionResult gtest_ar_13;
  Message local_460;
  int local_458 [2];
  undefined1 local_450 [8];
  AssertionResult gtest_ar_12;
  Message local_438;
  int local_430 [2];
  undefined1 local_428 [8];
  AssertionResult gtest_ar_11;
  Message local_410;
  int local_408 [2];
  undefined1 local_400 [8];
  AssertionResult gtest_ar_10;
  Message local_3e8;
  int local_3e0 [2];
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_9;
  Message local_3c0;
  int local_3b8 [2];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_8;
  Message local_398;
  int local_390 [2];
  undefined1 local_388 [8];
  AssertionResult gtest_ar_7;
  Message local_370;
  int local_368 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_6;
  Message local_348;
  int local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_5;
  Message local_320;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_4;
  Message local_2d8;
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_3;
  string local_290;
  DataFieldInfo *local_270;
  DataFieldInfo *field1;
  Message local_260;
  int local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_2;
  Message local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  size_type local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  int local_88 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  String local_68;
  AssertHelper local_58;
  Message local_50 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  FieldUnittest_Register_Test *this_local;
  
  gtest_ar_.message_.ptr_ = (String *)this;
  ser::Serializer::fieldnames_abi_cxx11_(&local_38,&(this->super_FieldUnittest).ser);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_38);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_20,bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_68,(AssertionResult *)local_20,"ser.fieldnames().empty()","false",
               "true");
    pcVar3 = testing::internal::String::c_str(&local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::String::~String(&local_68);
    testing::Message::~Message(local_50);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_88[1] = 0;
    local_88[0] = fs_fields(&(this->super_FieldUnittest).ser);
    testing::internal::EqHelper<true>::Compare<int,int>
              ((EqHelper<true> *)local_80,"0","fs_fields(&ser)",local_88 + 1,local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                 ,0x21,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message(&local_90);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"field1",&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"int",&local_e1);
      ser::Serializer::RegisterField
                (&(this->super_FieldUnittest).ser,&local_b8,&local_e0,4,0x2a,1,1,0xc,1,1,0,0,0,0,2,2
                );
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"field2",&local_109);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_130,"double",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7));
      ser::Serializer::RegisterField
                (&(this->super_FieldUnittest).ser,&local_108,&local_130,8,0x2a,0x1c,0x50,1,3,3,3,3,0
                 ,1,0,0);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      serializer = &(this->super_FieldUnittest).ser;
      fs_register_field(serializer,"field3",6,"int",3,4,0x2a,1,0x50,1,3,3,0,0,0,1,0,0);
      fs_register_field(serializer,"field4",6,"double",6,8,1,0x1c,0x50,0xc,0,0,2,2,0,0,1,1);
      iVar2 = fs_field_exists(serializer,"field1",6);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_148,iVar2 != 0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)&gtest_ar__2.message_,(AssertionResult *)local_148,
                   "fs_field_exists(&ser, \"field1\", 6)","false","true");
        pcVar3 = testing::internal::String::c_str((String *)&gtest_ar__2.message_);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                   ,0x2c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::internal::String::~String((String *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_150);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        iVar2 = fs_field_exists(&(this->super_FieldUnittest).ser,"field2",6);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_178,iVar2 != 0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&gtest_ar__3.message_,(AssertionResult *)local_178,
                     "fs_field_exists(&ser, \"field2\", 6)","false","true");
          pcVar3 = testing::internal::String::c_str((String *)&gtest_ar__3.message_);
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                     ,0x2d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_188,&local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          testing::internal::String::~String((String *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_180);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          iVar2 = fs_field_exists(&(this->super_FieldUnittest).ser,"field3",6);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_1a8,iVar2 != 0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
          if (!bVar1) {
            testing::Message::Message(&local_1b0);
            testing::internal::GetBoolAssertionFailureMessage
                      ((internal *)&gtest_ar__4.message_,(AssertionResult *)local_1a8,
                       "fs_field_exists(&ser, \"field3\", 6)","false","true");
            pcVar3 = testing::internal::String::c_str((String *)&gtest_ar__4.message_);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                       ,0x2e,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
            testing::internal::AssertHelper::~AssertHelper(&local_1b8);
            testing::internal::String::~String((String *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_1b0);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            iVar2 = fs_field_exists(&(this->super_FieldUnittest).ser,"field4",6);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_1d8,iVar2 != 0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
            if (!bVar1) {
              testing::Message::Message(&local_1e0);
              testing::internal::GetBoolAssertionFailureMessage
                        ((internal *)&gtest_ar_1.message_,(AssertionResult *)local_1d8,
                         "fs_field_exists(&ser, \"field4\", 6)","false","true");
              pcVar3 = testing::internal::String::c_str((String *)&gtest_ar_1.message_);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                         ,0x2f,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
              testing::internal::AssertHelper::~AssertHelper(&local_1e8);
              testing::internal::String::~String((String *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_1e0);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_20c = 4;
              ser::Serializer::fieldnames_abi_cxx11_(&local_230,&(this->super_FieldUnittest).ser);
              local_218 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&local_230);
              testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                        ((EqHelper<false> *)local_208,"4","ser.fieldnames().size()",&local_20c,
                         &local_218);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
              if (!bVar1) {
                testing::Message::Message(&local_238);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                           ,0x31,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_2.message_,&local_238);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_)
                ;
                testing::Message::~Message(&local_238);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_258[1] = 4;
                local_258[0] = fs_fields(&(this->super_FieldUnittest).ser);
                testing::internal::EqHelper<false>::Compare<int,int>
                          ((EqHelper<false> *)local_250,"4","fs_fields(&ser)",local_258 + 1,
                           local_258);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_250);
                if (!bVar1) {
                  testing::Message::Message(&local_260);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&field1,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                             ,0x32,pcVar3);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&field1,&local_260);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&field1);
                  testing::Message::~Message(&local_260);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_290,"field1",
                             (allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
                  pDVar4 = ser::Serializer::FindField(&(this->super_FieldUnittest).ser,&local_290);
                  std::__cxx11::string::~string((string *)&local_290);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
                  local_270 = pDVar4;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_2c8,"field1",&local_2c9);
                  psVar5 = ser::DataFieldInfo::name_abi_cxx11_(local_270);
                  testing::internal::EqHelper<false>::
                  Compare<std::__cxx11::string,std::__cxx11::string>
                            ((EqHelper<false> *)local_2a8,"std::string(\"field1\")","field1.name()",
                             &local_2c8,psVar5);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2a8);
                  if (!bVar1) {
                    testing::Message::Message(&local_2d8);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                               ,0x36,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_4.message_,&local_2d8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_4.message_);
                    testing::Message::~Message(&local_2d8);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_310,"int",&local_311);
                    psVar5 = ser::DataFieldInfo::type_abi_cxx11_(local_270);
                    testing::internal::EqHelper<false>::
                    Compare<std::__cxx11::string,std::__cxx11::string>
                              ((EqHelper<false> *)local_2f0,"std::string(\"int\")","field1.type()",
                               &local_310,psVar5);
                    std::__cxx11::string::~string((string *)&local_310);
                    std::allocator<char>::~allocator((allocator<char> *)&local_311);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2f0);
                    if (!bVar1) {
                      testing::Message::Message(&local_320);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2f0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                 ,0x37,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_5.message_,&local_320);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_5.message_);
                      testing::Message::~Message(&local_320);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                      local_340[1] = 4;
                      local_340[0] = ser::DataFieldInfo::bytesPerElement(local_270);
                      testing::internal::EqHelper<false>::Compare<int,int>
                                ((EqHelper<false> *)local_338,"4","field1.bytesPerElement()",
                                 local_340 + 1,local_340);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_338);
                      if (!bVar1) {
                        testing::Message::Message(&local_348);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_338);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                   ,0x38,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_6.message_,&local_348);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_6.message_);
                        testing::Message::~Message(&local_348);
                      }
                      gtest_ar.message_.ptr_._5_3_ = 0;
                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                        local_368[1] = 2;
                        local_368[0] = ser::DataFieldInfo::rank(local_270);
                        testing::internal::EqHelper<false>::Compare<int,int>
                                  ((EqHelper<false> *)local_360,"2","field1.rank()",local_368 + 1,
                                   local_368);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_360);
                        if (!bVar1) {
                          testing::Message::Message(&local_370);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_360);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                     ,0x39,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_7.message_,&local_370);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_7.message_);
                          testing::Message::~Message(&local_370);
                        }
                        gtest_ar.message_.ptr_._5_3_ = 0;
                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                          local_390[1] = 0x2a;
                          local_390[0] = ser::DataFieldInfo::iSize(local_270);
                          testing::internal::EqHelper<false>::Compare<int,int>
                                    ((EqHelper<false> *)local_388,"42","field1.iSize()",
                                     local_390 + 1,local_390);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_388);
                          if (!bVar1) {
                            testing::Message::Message(&local_398);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_388);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                       ,0x3a,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_8.message_,&local_398);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_8.message_);
                            testing::Message::~Message(&local_398);
                          }
                          gtest_ar.message_.ptr_._5_3_ = 0;
                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                            local_3b8[1] = 1;
                            local_3b8[0] = ser::DataFieldInfo::jSize(local_270);
                            testing::internal::EqHelper<false>::Compare<int,int>
                                      ((EqHelper<false> *)local_3b0,"1","field1.jSize()",
                                       local_3b8 + 1,local_3b8);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3b0);
                            if (!bVar1) {
                              testing::Message::Message(&local_3c0);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_3b0);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                         ,0x3b,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_9.message_,&local_3c0);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_9.message_);
                              testing::Message::~Message(&local_3c0);
                            }
                            gtest_ar.message_.ptr_._5_3_ = 0;
                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0)
                            ;
                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                              local_3e0[1] = 1;
                              local_3e0[0] = ser::DataFieldInfo::kSize(local_270);
                              testing::internal::EqHelper<false>::Compare<int,int>
                                        ((EqHelper<false> *)local_3d8,"1","field1.kSize()",
                                         local_3e0 + 1,local_3e0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3d8);
                              if (!bVar1) {
                                testing::Message::Message(&local_3e8);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3d8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                           ,0x3c,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_10.message_,&local_3e8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_10.message_);
                                testing::Message::~Message(&local_3e8);
                              }
                              gtest_ar.message_.ptr_._5_3_ = 0;
                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3d8);
                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                local_408[1] = 0xc;
                                local_408[0] = ser::DataFieldInfo::lSize(local_270);
                                testing::internal::EqHelper<false>::Compare<int,int>
                                          ((EqHelper<false> *)local_400,"12","field1.lSize()",
                                           local_408 + 1,local_408);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_400);
                                if (!bVar1) {
                                  testing::Message::Message(&local_410);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_400);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                             ,0x3d,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_11.message_,&local_410);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_11.message_);
                                  testing::Message::~Message(&local_410);
                                }
                                gtest_ar.message_.ptr_._5_3_ = 0;
                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_400);
                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                  local_430[1] = 1;
                                  local_430[0] = ser::DataFieldInfo::iMinusHaloSize(local_270);
                                  testing::internal::EqHelper<false>::Compare<int,int>
                                            ((EqHelper<false> *)local_428,"1",
                                             "field1.iMinusHaloSize()",local_430 + 1,local_430);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_428);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_438);
                                    pcVar3 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_428);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                               ,0x3e,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_12.message_,&local_438);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_);
                                    testing::Message::~Message(&local_438);
                                  }
                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_428);
                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                    local_458[1] = 0;
                                    local_458[0] = ser::DataFieldInfo::jMinusHaloSize(local_270);
                                    testing::internal::EqHelper<true>::Compare<int,int>
                                              ((EqHelper<true> *)local_450,"0",
                                               "field1.jMinusHaloSize()",local_458 + 1,local_458);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_450);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_460);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_450);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                 ,0x3f,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_13.message_,&local_460);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_);
                                      testing::Message::~Message(&local_460);
                                    }
                                    gtest_ar.message_.ptr_._5_3_ = 0;
                                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_450);
                                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                      local_480[1] = 0;
                                      local_480[0] = ser::DataFieldInfo::kMinusHaloSize(local_270);
                                      testing::internal::EqHelper<true>::Compare<int,int>
                                                ((EqHelper<true> *)local_478,"0",
                                                 "field1.kMinusHaloSize()",local_480 + 1,local_480);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_478);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_488);
                                        pcVar3 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_478);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x40,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_14.message_,&local_488)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_);
                                        testing::Message::~Message(&local_488);
                                      }
                                      gtest_ar.message_.ptr_._5_3_ = 0;
                                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_478);
                                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                        local_4a8[1] = 2;
                                        local_4a8[0] = ser::DataFieldInfo::lMinusHaloSize(local_270)
                                        ;
                                        testing::internal::EqHelper<false>::Compare<int,int>
                                                  ((EqHelper<false> *)local_4a0,"2",
                                                   "field1.lMinusHaloSize()",local_4a8 + 1,local_4a8
                                                  );
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_4a0);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_4b0);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_4a0);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x41,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     &local_4b0);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_);
                                          testing::Message::~Message(&local_4b0);
                                        }
                                        gtest_ar.message_.ptr_._5_3_ = 0;
                                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_4a0);
                                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                          local_4d0[1] = 1;
                                          local_4d0[0] = ser::DataFieldInfo::iPlusHaloSize
                                                                   (local_270);
                                          testing::internal::EqHelper<false>::Compare<int,int>
                                                    ((EqHelper<false> *)local_4c8,"1",
                                                     "field1.iPlusHaloSize()",local_4d0 + 1,
                                                     local_4d0);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_4c8);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_4d8);
                                            pcVar3 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_4c8);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_16.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x42,pcVar3);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_16.message_,
                                                       &local_4d8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_16.message_);
                                            testing::Message::~Message(&local_4d8);
                                          }
                                          gtest_ar.message_.ptr_._5_3_ = 0;
                                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_4c8);
                                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                            local_4f8[1] = 0;
                                            local_4f8[0] = ser::DataFieldInfo::jPlusHaloSize
                                                                     (local_270);
                                            testing::internal::EqHelper<true>::Compare<int,int>
                                                      ((EqHelper<true> *)local_4f0,"0",
                                                       "field1.jPlusHaloSize()",local_4f8 + 1,
                                                       local_4f8);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_4f0);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_500);
                                              pcVar3 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_4f0);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_17.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x43,pcVar3);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_17.message_,
                                                         &local_500);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_17.message_);
                                              testing::Message::~Message(&local_500);
                                            }
                                            gtest_ar.message_.ptr_._5_3_ = 0;
                                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_4f0);
                                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                              local_520[1] = 0;
                                              local_520[0] = ser::DataFieldInfo::kPlusHaloSize
                                                                       (local_270);
                                              testing::internal::EqHelper<true>::Compare<int,int>
                                                        ((EqHelper<true> *)local_518,"0",
                                                         "field1.kPlusHaloSize()",local_520 + 1,
                                                         local_520);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_518);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_528);
                                                pcVar3 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_518);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_18.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x44,pcVar3);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_18.message_,
                                                           &local_528);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_18.message_);
                                                testing::Message::~Message(&local_528);
                                              }
                                              gtest_ar.message_.ptr_._5_3_ = 0;
                                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_518);
                                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                local_548[1] = 2;
                                                local_548[0] = ser::DataFieldInfo::lPlusHaloSize
                                                                         (local_270);
                                                testing::internal::EqHelper<false>::Compare<int,int>
                                                          ((EqHelper<false> *)local_540,"2",
                                                           "field1.lPlusHaloSize()",local_548 + 1,
                                                           local_548);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_540);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_550);
                                                  pcVar3 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_540);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&field2,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x45,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&field2,&local_550);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&field2);
                                                  testing::Message::~Message(&local_550);
                                                }
                                                gtest_ar.message_.ptr_._5_3_ = 0;
                                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_540);
                                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)&local_580,"field2",
                                                             (allocator *)
                                                             ((long)&gtest_ar_19.message_.ptr_ + 7))
                                                  ;
                                                  pDVar4 = ser::Serializer::FindField
                                                                     (&(this->super_FieldUnittest).
                                                                       ser,&local_580);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_580);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_19.message_.ptr_ + 7))
                                                  ;
                                                  local_560 = pDVar4;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)&local_5b8,"field2",
                                                             &local_5b9);
                                                  psVar5 = ser::DataFieldInfo::name_abi_cxx11_
                                                                     (local_560);
                                                  testing::internal::EqHelper<false>::
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_598,
                                                             "std::string(\"field2\")",
                                                             "field2.name()",&local_5b8,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_5b8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_5b9);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_598);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_5c8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_598);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_20.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x48,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_20.message_,
                                                             &local_5c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_20.message_);
                                                  testing::Message::~Message(&local_5c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_598);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_600,"double",
                                                               &local_601);
                                                    psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                                                       (local_560);
                                                    testing::internal::EqHelper<false>::
                                                                                                        
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_5e0,
                                                             "std::string(\"double\")",
                                                             "field2.type()",&local_600,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_600);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_601);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_5e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_610);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_5e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_21.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x49,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_21.message_,
                                                             &local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_21.message_);
                                                  testing::Message::~Message(&local_610);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_630[1] = 8;
                                                    local_630[0] = ser::DataFieldInfo::
                                                                   bytesPerElement(local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_628,
                                                                     "8","field2.bytesPerElement()",
                                                                     local_630 + 1,local_630);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_628)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_638);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_628);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_22.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_22.message_,
                                                             &local_638);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_22.message_);
                                                  testing::Message::~Message(&local_638);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_628);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_658[1] = 3;
                                                    local_658[0] = ser::DataFieldInfo::rank
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_650,
                                                                     "3","field2.rank()",
                                                                     local_658 + 1,local_658);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_650)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_660);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_650);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_23.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4b,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             &local_660);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_660);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_650);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_680[1] = 0x2a;
                                                    local_680[0] = ser::DataFieldInfo::iSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_678,
                                                                     "42","field2.iSize()",
                                                                     local_680 + 1,local_680);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_678)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_688);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_678);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_24.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_688);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_688);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_678);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6a8[1] = 0x1c;
                                                    local_6a8[0] = ser::DataFieldInfo::jSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_6a0,
                                                                     "28","field2.jSize()",
                                                                     local_6a8 + 1,local_6a8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6a0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6b0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6a0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_25.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4d,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_6b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_6b0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6a0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6d0[1] = 0x50;
                                                    local_6d0[0] = ser::DataFieldInfo::kSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_6c8,
                                                                     "80","field2.kSize()",
                                                                     local_6d0 + 1,local_6d0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6c8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6d8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_26.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_26.message_,
                                                             &local_6d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_26.message_);
                                                  testing::Message::~Message(&local_6d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6f8[1] = 1;
                                                    local_6f8[0] = ser::DataFieldInfo::lSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_6f0,
                                                                     "1","field2.lSize()",
                                                                     local_6f8 + 1,local_6f8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6f0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_700);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_27.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_27.message_,
                                                             &local_700);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_27.message_);
                                                  testing::Message::~Message(&local_700);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_720[1] = 3;
                                                    local_720[0] = ser::DataFieldInfo::
                                                                   iMinusHaloSize(local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_718,
                                                                     "3","field2.iMinusHaloSize()",
                                                                     local_720 + 1,local_720);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_718)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_728);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_718);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_28.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x50,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_28.message_,
                                                             &local_728);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_28.message_);
                                                  testing::Message::~Message(&local_728);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_718);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_748[1] = 3;
                                                    local_748[0] = ser::DataFieldInfo::
                                                                   jMinusHaloSize(local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_740,
                                                                     "3","field2.jMinusHaloSize()",
                                                                     local_748 + 1,local_748);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_740)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_750);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_740);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_29.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x51,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_29.message_,
                                                             &local_750);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_29.message_);
                                                  testing::Message::~Message(&local_750);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_740);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_770[1] = 0;
                                                    local_770[0] = ser::DataFieldInfo::
                                                                   kMinusHaloSize(local_560);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_768,"0"
                                                                     ,"field2.kMinusHaloSize()",
                                                                     local_770 + 1,local_770);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_768)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_778);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_768);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_30.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x52,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_30.message_,
                                                             &local_778);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_30.message_);
                                                  testing::Message::~Message(&local_778);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_768);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_798[1] = 0;
                                                    local_798[0] = ser::DataFieldInfo::
                                                                   lMinusHaloSize(local_560);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_790,"0"
                                                                     ,"field2.lMinusHaloSize()",
                                                                     local_798 + 1,local_798);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_790)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7a0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_790);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_31.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x53,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_31.message_,
                                                             &local_7a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_31.message_);
                                                  testing::Message::~Message(&local_7a0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_790);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7c0[1] = 3;
                                                    local_7c0[0] = ser::DataFieldInfo::iPlusHaloSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_7b8,
                                                                     "3","field2.iPlusHaloSize()",
                                                                     local_7c0 + 1,local_7c0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7b8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7c8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_7b8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_32.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x54,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_32.message_,
                                                             &local_7c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_32.message_);
                                                  testing::Message::~Message(&local_7c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7b8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7e8[1] = 3;
                                                    local_7e8[0] = ser::DataFieldInfo::jPlusHaloSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_7e0,
                                                                     "3","field2.jPlusHaloSize()",
                                                                     local_7e8 + 1,local_7e8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7e0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7f0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_7e0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_33.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x55,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_33.message_,
                                                             &local_7f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_33.message_);
                                                  testing::Message::~Message(&local_7f0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_810[1] = 1;
                                                    local_810[0] = ser::DataFieldInfo::kPlusHaloSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_808,
                                                                     "1","field2.kPlusHaloSize()",
                                                                     local_810 + 1,local_810);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_808)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_818);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_808);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_34.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x56,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_34.message_,
                                                             &local_818);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_34.message_);
                                                  testing::Message::~Message(&local_818);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_808);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_838[1] = 0;
                                                    local_838[0] = ser::DataFieldInfo::lPlusHaloSize
                                                                             (local_560);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_830,"0"
                                                                     ,"field2.lPlusHaloSize()",
                                                                     local_838 + 1,local_838);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_830)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_840);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_830);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)&field3,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x57,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&field3,&local_840);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&field3);
                                                  testing::Message::~Message(&local_840);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_830);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_870,"field3",
                                                               (allocator *)
                                                               ((long)&gtest_ar_35.message_.ptr_ + 7
                                                               ));
                                                    pDVar4 = ser::Serializer::FindField
                                                                       (&(this->super_FieldUnittest)
                                                                         .ser,&local_870);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_870);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)&gtest_ar_35.message_.ptr_ + 7
                                                               ));
                                                    local_850 = pDVar4;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_8a8,"field3",
                                                               &local_8a9);
                                                    psVar5 = ser::DataFieldInfo::name_abi_cxx11_
                                                                       (local_850);
                                                    testing::internal::EqHelper<false>::
                                                                                                        
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_888,
                                                             "std::string(\"field3\")",
                                                             "field3.name()",&local_8a8,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8a8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_8a9);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_888);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_8b8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_888);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_36.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_36.message_,
                                                             &local_8b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_36.message_);
                                                  testing::Message::~Message(&local_8b8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_888);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_8f0,"int",&local_8f1
                                                              );
                                                    psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                                                       (local_850);
                                                    testing::internal::EqHelper<false>::
                                                                                                        
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_8d0,
                                                             "std::string(\"int\")","field3.type()",
                                                             &local_8f0,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8f0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_8f1);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_8d0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_900);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_8d0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_37.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5b,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37.message_,
                                                             &local_900);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37.message_);
                                                  testing::Message::~Message(&local_900);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8d0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_920[1] = 4;
                                                    local_920[0] = ser::DataFieldInfo::
                                                                   bytesPerElement(local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_918,
                                                                     "4","field3.bytesPerElement()",
                                                                     local_920 + 1,local_920);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_918)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_928);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_918);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_38.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_38.message_,
                                                             &local_928);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_38.message_);
                                                  testing::Message::~Message(&local_928);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_918);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_948[1] = 2;
                                                    local_948[0] = ser::DataFieldInfo::rank
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_940,
                                                                     "2","field3.rank()",
                                                                     local_948 + 1,local_948);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_940)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_950);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_940);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_39.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5d,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_39.message_,
                                                             &local_950);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_39.message_);
                                                  testing::Message::~Message(&local_950);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_940);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_970[1] = 0x2a;
                                                    local_970[0] = ser::DataFieldInfo::iSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_968,
                                                                     "42","field3.iSize()",
                                                                     local_970 + 1,local_970);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_968)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_978);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_968);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_40.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_40.message_,
                                                             &local_978);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_40.message_);
                                                  testing::Message::~Message(&local_978);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_968);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_998[1] = 1;
                                                    local_998[0] = ser::DataFieldInfo::jSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_990,
                                                                     "1","field3.jSize()",
                                                                     local_998 + 1,local_998);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_990)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9a0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_990);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_41.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_41.message_,
                                                             &local_9a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_41.message_);
                                                  testing::Message::~Message(&local_9a0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_990);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_9c0[1] = 0x50;
                                                    local_9c0[0] = ser::DataFieldInfo::kSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_9b8,
                                                                     "80","field3.kSize()",
                                                                     local_9c0 + 1,local_9c0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9b8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9c8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_9b8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_42.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x60,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_42.message_,
                                                             &local_9c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_42.message_);
                                                  testing::Message::~Message(&local_9c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9b8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_9e8[1] = 1;
                                                    local_9e8[0] = ser::DataFieldInfo::lSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_9e0,
                                                                     "1","field3.lSize()",
                                                                     local_9e8 + 1,local_9e8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9e0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9f0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_9e0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_43.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x61,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_43.message_,
                                                             &local_9f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_43.message_);
                                                  testing::Message::~Message(&local_9f0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a10[1] = 3;
                                                    local_a10[0] = ser::DataFieldInfo::
                                                                   iMinusHaloSize(local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_a08,
                                                                     "3","field3.iMinusHaloSize()",
                                                                     local_a10 + 1,local_a10);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a08)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a18);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a08);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_44.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x62,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_44.message_,
                                                             &local_a18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_44.message_);
                                                  testing::Message::~Message(&local_a18);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a08);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a38[1] = 0;
                                                    local_a38[0] = ser::DataFieldInfo::
                                                                   jMinusHaloSize(local_850);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_a30,"0"
                                                                     ,"field3.jMinusHaloSize()",
                                                                     local_a38 + 1,local_a38);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a30)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a40);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a30);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_45.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,99,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_45.message_,
                                                             &local_a40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_45.message_);
                                                  testing::Message::~Message(&local_a40);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a30);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a60[1] = 0;
                                                    local_a60[0] = ser::DataFieldInfo::
                                                                   kMinusHaloSize(local_850);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_a58,"0"
                                                                     ,"field3.kMinusHaloSize()",
                                                                     local_a60 + 1,local_a60);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a58)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a68);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a58);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_46.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,100,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_46.message_,
                                                             &local_a68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_46.message_);
                                                  testing::Message::~Message(&local_a68);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a58);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a88[1] = 0;
                                                    local_a88[0] = ser::DataFieldInfo::
                                                                   lMinusHaloSize(local_850);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_a80,"0"
                                                                     ,"field3.lMinusHaloSize()",
                                                                     local_a88 + 1,local_a88);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a80)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a90);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a80);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_47.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x65,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_47.message_,
                                                             &local_a90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_47.message_);
                                                  testing::Message::~Message(&local_a90);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a80);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ab0[1] = 3;
                                                    local_ab0[0] = ser::DataFieldInfo::iPlusHaloSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_aa8,
                                                                     "3","field3.iPlusHaloSize()",
                                                                     local_ab0 + 1,local_ab0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_aa8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ab8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_aa8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_48.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x66,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_48.message_,
                                                             &local_ab8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_48.message_);
                                                  testing::Message::~Message(&local_ab8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_aa8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ad8[1] = 0;
                                                    local_ad8[0] = ser::DataFieldInfo::jPlusHaloSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_ad0,"0"
                                                                     ,"field3.jPlusHaloSize()",
                                                                     local_ad8 + 1,local_ad8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ad0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ae0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ad0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_49.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x67,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             &local_ae0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_);
                                                  testing::Message::~Message(&local_ae0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ad0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_b00[1] = 1;
                                                    local_b00[0] = ser::DataFieldInfo::kPlusHaloSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_af8,
                                                                     "1","field3.kPlusHaloSize()",
                                                                     local_b00 + 1,local_b00);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_af8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b08);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_af8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_50.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x68,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             &local_b08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_);
                                                  testing::Message::~Message(&local_b08);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_af8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_b28[1] = 0;
                                                    local_b28[0] = ser::DataFieldInfo::lPlusHaloSize
                                                                             (local_850);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_b20,"0"
                                                                     ,"field3.lPlusHaloSize()",
                                                                     local_b28 + 1,local_b28);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b20)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b30);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_b20);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)&field4,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x69,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&field4,&local_b30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&field4);
                                                  testing::Message::~Message(&local_b30);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b20);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_b60,"field4",
                                                               (allocator *)
                                                               ((long)&gtest_ar_51.message_.ptr_ + 7
                                                               ));
                                                    pDVar4 = ser::Serializer::FindField
                                                                       (&(this->super_FieldUnittest)
                                                                         .ser,&local_b60);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_b60);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)&gtest_ar_51.message_.ptr_ + 7
                                                               ));
                                                    local_b40 = pDVar4;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_b98,"field4",
                                                               &local_b99);
                                                    psVar5 = ser::DataFieldInfo::name_abi_cxx11_
                                                                       (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                                                                        
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_b78,
                                                             "std::string(\"field4\")",
                                                             "field4.name()",&local_b98,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b98);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_b99);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b78);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_ba8);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_b78);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_52.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_52.message_,
                                                             &local_ba8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_52.message_);
                                                  testing::Message::~Message(&local_ba8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b78);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_be0,"double",
                                                               &local_be1);
                                                    psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                                                       (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                                                                        
                                                  Compare<std::__cxx11::string,std::__cxx11::string>
                                                            ((EqHelper<false> *)local_bc0,
                                                             "std::string(\"double\")",
                                                             "field4.type()",&local_be0,psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_be0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_be1);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_bc0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_bf0);
                                                    pcVar3 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_bc0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_53.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6d,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_53.message_,
                                                             &local_bf0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_53.message_);
                                                  testing::Message::~Message(&local_bf0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_bc0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c10[1] = 8;
                                                    local_c10[0] = ser::DataFieldInfo::
                                                                   bytesPerElement(local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_c08,
                                                                     "8","field4.bytesPerElement()",
                                                                     local_c10 + 1,local_c10);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c08)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c18);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c08);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_54.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_54.message_,
                                                             &local_c18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_54.message_);
                                                  testing::Message::~Message(&local_c18);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c08);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c38[1] = 3;
                                                    local_c38[0] = ser::DataFieldInfo::rank
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_c30,
                                                                     "3","field4.rank()",
                                                                     local_c38 + 1,local_c38);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c30)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c40);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c30);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_55.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_55.message_,
                                                             &local_c40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_55.message_);
                                                  testing::Message::~Message(&local_c40);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c30);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c60[1] = 1;
                                                    local_c60[0] = ser::DataFieldInfo::iSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_c58,
                                                                     "1","field4.iSize()",
                                                                     local_c60 + 1,local_c60);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c58)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c68);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c58);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_56.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x70,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_56.message_,
                                                             &local_c68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_56.message_);
                                                  testing::Message::~Message(&local_c68);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c58);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c88[1] = 0x1c;
                                                    local_c88[0] = ser::DataFieldInfo::jSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_c80,
                                                                     "28","field4.jSize()",
                                                                     local_c88 + 1,local_c88);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c80)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c90);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c80);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_57.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x71,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_57.message_,
                                                             &local_c90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_57.message_);
                                                  testing::Message::~Message(&local_c90);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c80);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_cb0[1] = 0x50;
                                                    local_cb0[0] = ser::DataFieldInfo::kSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_ca8,
                                                                     "80","field4.kSize()",
                                                                     local_cb0 + 1,local_cb0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ca8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_cb8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ca8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_58.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x72,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_58.message_,
                                                             &local_cb8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_58.message_);
                                                  testing::Message::~Message(&local_cb8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ca8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_cd8[1] = 0xc;
                                                    local_cd8[0] = ser::DataFieldInfo::lSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_cd0,
                                                                     "12","field4.lSize()",
                                                                     local_cd8 + 1,local_cd8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_cd0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ce0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_cd0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_59.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x73,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_59.message_,
                                                             &local_ce0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_59.message_);
                                                  testing::Message::~Message(&local_ce0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_cd0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d00[1] = 0;
                                                    local_d00[0] = ser::DataFieldInfo::
                                                                   iMinusHaloSize(local_b40);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_cf8,"0"
                                                                     ,"field4.iMinusHaloSize()",
                                                                     local_d00 + 1,local_d00);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_cf8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d08);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_cf8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_60.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x74,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_60.message_,
                                                             &local_d08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_60.message_);
                                                  testing::Message::~Message(&local_d08);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_cf8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d28[1] = 2;
                                                    local_d28[0] = ser::DataFieldInfo::
                                                                   jMinusHaloSize(local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_d20,
                                                                     "2","field4.jMinusHaloSize()",
                                                                     local_d28 + 1,local_d28);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d20)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d30);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d20);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_61.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x75,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_61.message_,
                                                             &local_d30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_61.message_);
                                                  testing::Message::~Message(&local_d30);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d20);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d50[1] = 0;
                                                    local_d50[0] = ser::DataFieldInfo::
                                                                   kMinusHaloSize(local_b40);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_d48,"0"
                                                                     ,"field4.kMinusHaloSize()",
                                                                     local_d50 + 1,local_d50);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d48)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d58);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d48);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_62.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x76,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_62.message_,
                                                             &local_d58);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_62.message_);
                                                  testing::Message::~Message(&local_d58);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d48);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d78[1] = 1;
                                                    local_d78[0] = ser::DataFieldInfo::
                                                                   lMinusHaloSize(local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_d70,
                                                                     "1","field4.lMinusHaloSize()",
                                                                     local_d78 + 1,local_d78);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d70)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d80);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d70);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_63.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x77,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_63.message_,
                                                             &local_d80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_63.message_);
                                                  testing::Message::~Message(&local_d80);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d70);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_da0[1] = 0;
                                                    local_da0[0] = ser::DataFieldInfo::iPlusHaloSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_d98,"0"
                                                                     ,"field4.iPlusHaloSize()",
                                                                     local_da0 + 1,local_da0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d98)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_da8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d98);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_64.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x78,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_64.message_,
                                                             &local_da8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_64.message_);
                                                  testing::Message::~Message(&local_da8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d98);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_dc8[1] = 2;
                                                    local_dc8[0] = ser::DataFieldInfo::jPlusHaloSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_dc0,
                                                                     "2","field4.jPlusHaloSize()",
                                                                     local_dc8 + 1,local_dc8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_dc0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_dd0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_dc0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_65.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x79,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_65.message_,
                                                             &local_dd0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_65.message_);
                                                  testing::Message::~Message(&local_dd0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_dc0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_df0[1] = 0;
                                                    local_df0[0] = ser::DataFieldInfo::kPlusHaloSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_de8,"0"
                                                                     ,"field4.kPlusHaloSize()",
                                                                     local_df0 + 1,local_df0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_de8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_df8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_de8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_66.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x7a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_66.message_,
                                                             &local_df8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_66.message_);
                                                  testing::Message::~Message(&local_df8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_de8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_e18[1] = 1;
                                                    local_e18[0] = ser::DataFieldInfo::lPlusHaloSize
                                                                             (local_b40);
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_e10,
                                                                     "1","field4.lPlusHaloSize()",
                                                                     local_e18 + 1,local_e18);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e10)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_e20);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_e10);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)&iSize,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x7b,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&iSize,&local_e20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&iSize);
                                                  testing::Message::~Message(&local_e20);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e10);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    fs_get_fieldinfo(&(this->super_FieldUnittest).
                                                                      ser,"field1",6,&jSize,&kSize,
                                                                     &lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize,&local_e58,
                                                                     (int *)((long)&gtest_ar_67.
                                                                                    message_.ptr_ +
                                                                            4));
                                                    local_e74 = 4;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_e70,
                                                                     "4","bytesPerElement",
                                                                     &local_e74,&jSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e70)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_e80);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_e70);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_68.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x86,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_68.message_,
                                                             &local_e80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_68.message_);
                                                  testing::Message::~Message(&local_e80);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e70);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_e9c = 0x2a;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_e98,
                                                                     "42","iSize",&local_e9c,&kSize)
                                                    ;
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e98)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ea8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_e98);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_69.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x87,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_69.message_,
                                                             &local_ea8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_69.message_);
                                                  testing::Message::~Message(&local_ea8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e98);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ec4 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_ec0,
                                                                     "1","jSize",&local_ec4,&lSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ec0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ed0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ec0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_70.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x88,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_70.message_,
                                                             &local_ed0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_70.message_);
                                                  testing::Message::~Message(&local_ed0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ec0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_eec = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_ee8,
                                                                     "1","kSize",&local_eec,
                                                                     &iMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ee8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ef8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ee8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_71.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x89,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_71.message_,
                                                             &local_ef8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_71.message_);
                                                  testing::Message::~Message(&local_ef8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ee8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_f14 = 0xc;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_f10,
                                                                     "12","lSize",&local_f14,
                                                                     &iPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f10)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_f20);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_f10);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_72.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_72.message_,
                                                             &local_f20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_72.message_);
                                                  testing::Message::~Message(&local_f20);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f10);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_f3c = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_f38,
                                                                     "1","iMinusHaloSize",&local_f3c
                                                                     ,&jMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f38)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_f48);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_f38);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_73.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8b,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_73.message_,
                                                             &local_f48);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_73.message_);
                                                  testing::Message::~Message(&local_f48);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f38);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_f64 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_f60,"0"
                                                                     ,"jMinusHaloSize",&local_f64,
                                                                     &kMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f60)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_f70);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_f60);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_74.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_74.message_,
                                                             &local_f70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_74.message_);
                                                  testing::Message::~Message(&local_f70);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f60);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_f8c = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_f88,"0"
                                                                     ,"kMinusHaloSize",&local_f8c,
                                                                     &lMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f88)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_f98);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_f88);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_75.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8d,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_75.message_,
                                                             &local_f98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_75.message_);
                                                  testing::Message::~Message(&local_f98);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f88);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_fb4 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_fb0,
                                                                     "2","lMinusHaloSize",&local_fb4
                                                                     ,&local_e58);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_fb0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_fc0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_fb0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_76.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_76.message_,
                                                             &local_fc0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_76.message_);
                                                  testing::Message::~Message(&local_fc0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_fb0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_fdc = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_fd8,
                                                                     "1","iPlusHaloSize",&local_fdc,
                                                                     &jPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_fd8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_fe8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_fd8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_77.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_77.message_,
                                                             &local_fe8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_77.message_);
                                                  testing::Message::~Message(&local_fe8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_fd8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1004 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1000,
                                                                     "0","jPlusHaloSize",&local_1004
                                                                     ,&kPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1000
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1010);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1000);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_78.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x90,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_78.message_,
                                                             &local_1010);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_78.message_);
                                                  testing::Message::~Message(&local_1010);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1000);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_102c = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1028,
                                                                     "0","kPlusHaloSize",&local_102c
                                                                     ,&lPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1028
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1038);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1028);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_79.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x91,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_79.message_,
                                                             &local_1038);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_79.message_);
                                                  testing::Message::~Message(&local_1038);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1028);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1054 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1050,
                                                                     "2","lPlusHaloSize",&local_1054
                                                                     ,(int *)((long)&gtest_ar_67.
                                                                                     message_.ptr_ +
                                                                             4));
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1050
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1060);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1050);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_80.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x92,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_80.message_,
                                                             &local_1060);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_80.message_);
                                                  testing::Message::~Message(&local_1060);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1050);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    fs_get_fieldinfo(&(this->super_FieldUnittest).
                                                                      ser,"field2",6,&jSize,&kSize,
                                                                     &lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize,&local_e58,
                                                                     (int *)((long)&gtest_ar_67.
                                                                                    message_.ptr_ +
                                                                            4));
                                                    local_107c = 8;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1078,
                                                                     "8","bytesPerElement",
                                                                     &local_107c,&jSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1078
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1088);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1078);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_81.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x98,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_81.message_,
                                                             &local_1088);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_81.message_);
                                                  testing::Message::~Message(&local_1088);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1078);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_10a4 = 0x2a;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_10a0,
                                                                     "42","iSize",&local_10a4,&kSize
                                                                    );
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_10a0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_10b0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_10a0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_82.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x99,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_82.message_,
                                                             &local_10b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_82.message_);
                                                  testing::Message::~Message(&local_10b0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_10a0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_10cc = 0x1c;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_10c8,
                                                                     "28","jSize",&local_10cc,&lSize
                                                                    );
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_10c8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_10d8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_10c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_83.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_83.message_,
                                                             &local_10d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_83.message_);
                                                  testing::Message::~Message(&local_10d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_10c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_10f4 = 0x50;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_10f0,
                                                                     "80","kSize",&local_10f4,
                                                                     &iMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_10f0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1100);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_10f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_84.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9b,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_84.message_,
                                                             &local_1100);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_84.message_);
                                                  testing::Message::~Message(&local_1100);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_10f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_111c = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1118,
                                                                     "1","lSize",&local_111c,
                                                                     &iPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1118
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1128);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1118);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_85.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9c,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_85.message_,
                                                             &local_1128);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_85.message_);
                                                  testing::Message::~Message(&local_1128);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1118);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1144 = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1140,
                                                                     "3","iMinusHaloSize",
                                                                     &local_1144,&jMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1140
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1150);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1140);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_86.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9d,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_86.message_,
                                                             &local_1150);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_86.message_);
                                                  testing::Message::~Message(&local_1150);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1140);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_116c = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1168,
                                                                     "3","jMinusHaloSize",
                                                                     &local_116c,&kMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1168
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1178);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1168);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_87.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9e,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_87.message_,
                                                             &local_1178);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_87.message_);
                                                  testing::Message::~Message(&local_1178);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1168);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1194 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1190,
                                                                     "0","kMinusHaloSize",
                                                                     &local_1194,&lMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1190
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_11a0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1190);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_88.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9f,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_88.message_,
                                                             &local_11a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_88.message_);
                                                  testing::Message::~Message(&local_11a0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1190);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_11bc = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_11b8,
                                                                     "0","lMinusHaloSize",
                                                                     &local_11bc,&local_e58);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_11b8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_11c8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_11b8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_89.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa0,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_89.message_,
                                                             &local_11c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_89.message_);
                                                  testing::Message::~Message(&local_11c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_11b8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_11e4 = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_11e0,
                                                                     "3","iPlusHaloSize",&local_11e4
                                                                     ,&jPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_11e0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_11f0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_11e0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_90.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa1,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_90.message_,
                                                             &local_11f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_90.message_);
                                                  testing::Message::~Message(&local_11f0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_11e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_120c = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1208,
                                                                     "3","jPlusHaloSize",&local_120c
                                                                     ,&kPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1208
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1218);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1208);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_91.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa2,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_91.message_,
                                                             &local_1218);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_91.message_);
                                                  testing::Message::~Message(&local_1218);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1208);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1234 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1230,
                                                                     "1","kPlusHaloSize",&local_1234
                                                                     ,&lPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1230
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1240);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1230);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_92.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa3,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_92.message_,
                                                             &local_1240);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_92.message_);
                                                  testing::Message::~Message(&local_1240);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1230);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_125c = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1258,
                                                                     "0","lPlusHaloSize",&local_125c
                                                                     ,(int *)((long)&gtest_ar_67.
                                                                                     message_.ptr_ +
                                                                             4));
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1258
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1268);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1258);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_93.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa4,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_93.message_,
                                                             &local_1268);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_93.message_);
                                                  testing::Message::~Message(&local_1268);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1258);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    fs_get_fieldinfo(&(this->super_FieldUnittest).
                                                                      ser,"field3",6,&jSize,&kSize,
                                                                     &lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize,&local_e58,
                                                                     (int *)((long)&gtest_ar_67.
                                                                                    message_.ptr_ +
                                                                            4));
                                                    local_1284 = 4;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1280,
                                                                     "4","bytesPerElement",
                                                                     &local_1284,&jSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1280
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1290);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1280);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_94.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xaa,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_94.message_,
                                                             &local_1290);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_94.message_);
                                                  testing::Message::~Message(&local_1290);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1280);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_12ac = 0x2a;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_12a8,
                                                                     "42","iSize",&local_12ac,&kSize
                                                                    );
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_12a8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_12b8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_12a8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_95.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xab,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_95.message_,
                                                             &local_12b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_95.message_);
                                                  testing::Message::~Message(&local_12b8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12a8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_12d4 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_12d0,
                                                                     "1","jSize",&local_12d4,&lSize)
                                                    ;
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_12d0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_12e0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_12d0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_96.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xac,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_96.message_,
                                                             &local_12e0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_96.message_);
                                                  testing::Message::~Message(&local_12e0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12d0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_12fc = 0x50;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_12f8,
                                                                     "80","kSize",&local_12fc,
                                                                     &iMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_12f8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1308);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_12f8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_97.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xad,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_97.message_,
                                                             &local_1308);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_97.message_);
                                                  testing::Message::~Message(&local_1308);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12f8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1324 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1320,
                                                                     "1","lSize",&local_1324,
                                                                     &iPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1320
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1330);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1320);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_98.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xae,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_98.message_,
                                                             &local_1330);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_98.message_);
                                                  testing::Message::~Message(&local_1330);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1320);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_134c = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1348,
                                                                     "3","iMinusHaloSize",
                                                                     &local_134c,&jMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1348
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1358);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1348);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_99.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xaf,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_99.message_,
                                                             &local_1358);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_99.message_);
                                                  testing::Message::~Message(&local_1358);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1348);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1374 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1370,
                                                                     "0","jMinusHaloSize",
                                                                     &local_1374,&kMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1370
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1380);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1370);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_100.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb0,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_100.message_,
                                                             &local_1380);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_100.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1380);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1370);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_139c = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1398,
                                                                     "0","kMinusHaloSize",
                                                                     &local_139c,&lMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1398
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_13a8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1398);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_101.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb1,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_101.message_,
                                                             &local_13a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_101.message_)
                                                  ;
                                                  testing::Message::~Message(&local_13a8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1398);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_13c4 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_13c0,
                                                                     "0","lMinusHaloSize",
                                                                     &local_13c4,&local_e58);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_13c0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_13d0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_13c0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_102.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb2,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_102.message_,
                                                             &local_13d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_102.message_)
                                                  ;
                                                  testing::Message::~Message(&local_13d0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13c0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_13ec = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_13e8,
                                                                     "3","iPlusHaloSize",&local_13ec
                                                                     ,&jPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_13e8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_13f8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_13e8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_103.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb3,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_103.message_,
                                                             &local_13f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_103.message_)
                                                  ;
                                                  testing::Message::~Message(&local_13f8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13e8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1414 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1410,
                                                                     "0","jPlusHaloSize",&local_1414
                                                                     ,&kPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1410
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1420);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1410);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_104.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb4,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_104.message_,
                                                             &local_1420);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_104.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1420);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1410);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_143c = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1438,
                                                                     "1","kPlusHaloSize",&local_143c
                                                                     ,&lPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1438
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1448);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1438);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_105.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb5,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_105.message_,
                                                             &local_1448);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_105.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1448);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1438);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1464 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1460,
                                                                     "0","lPlusHaloSize",&local_1464
                                                                     ,(int *)((long)&gtest_ar_67.
                                                                                     message_.ptr_ +
                                                                             4));
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1460
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1470);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1460);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_106.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb6,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_106.message_,
                                                             &local_1470);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_106.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1470);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1460);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    fs_get_fieldinfo(&(this->super_FieldUnittest).
                                                                      ser,"field4",6,&jSize,&kSize,
                                                                     &lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize,&local_e58,
                                                                     (int *)((long)&gtest_ar_67.
                                                                                    message_.ptr_ +
                                                                            4));
                                                    local_148c = 8;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1488,
                                                                     "8","bytesPerElement",
                                                                     &local_148c,&jSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1488
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1498);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1488);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_107.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbc,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_107.message_,
                                                             &local_1498);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_107.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1498);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1488);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_14b4 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_14b0,
                                                                     "1","iSize",&local_14b4,&kSize)
                                                    ;
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_14b0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_14c0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_14b0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_108.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbd,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_108.message_,
                                                             &local_14c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_108.message_)
                                                  ;
                                                  testing::Message::~Message(&local_14c0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14b0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_14dc = 0x1c;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_14d8,
                                                                     "28","jSize",&local_14dc,&lSize
                                                                    );
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_14d8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_14e8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_14d8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_109.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbe,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_109.message_,
                                                             &local_14e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_109.message_)
                                                  ;
                                                  testing::Message::~Message(&local_14e8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14d8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1504 = 0x50;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1500,
                                                                     "80","kSize",&local_1504,
                                                                     &iMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1500
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1510);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1500);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_110.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbf,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_110.message_,
                                                             &local_1510);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_110.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1510);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1500);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_152c = 0xc;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1528,
                                                                     "12","lSize",&local_152c,
                                                                     &iPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1528
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1538);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1528);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_111.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc0,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_111.message_,
                                                             &local_1538);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_111.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1538);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1528);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1554 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1550,
                                                                     "0","iMinusHaloSize",
                                                                     &local_1554,&jMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1550
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1560);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1550);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_112.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc1,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_112.message_,
                                                             &local_1560);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_112.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1560);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1550);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_157c = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1578,
                                                                     "2","jMinusHaloSize",
                                                                     &local_157c,&kMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1578
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1588);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1578);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_113.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc2,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_113.message_,
                                                             &local_1588);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_113.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1588);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1578);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_15a4 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_15a0,
                                                                     "0","kMinusHaloSize",
                                                                     &local_15a4,&lMinusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_15a0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_15b0);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_15a0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_114.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc3,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_114.message_,
                                                             &local_15b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_114.message_)
                                                  ;
                                                  testing::Message::~Message(&local_15b0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15a0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_15cc = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_15c8,
                                                                     "1","lMinusHaloSize",
                                                                     &local_15cc,&local_e58);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_15c8
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_15d8);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_15c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_115.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc4,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_115.message_,
                                                             &local_15d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_115.message_)
                                                  ;
                                                  testing::Message::~Message(&local_15d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_15f4 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_15f0,
                                                                     "0","iPlusHaloSize",&local_15f4
                                                                     ,&jPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_15f0
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1600);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_15f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_116.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc5,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_116.message_,
                                                             &local_1600);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_116.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1600);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_161c = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1618,
                                                                     "2","jPlusHaloSize",&local_161c
                                                                     ,&kPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1618
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1628);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1618);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_117.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc6,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_117.message_,
                                                             &local_1628);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_117.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1628);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1618);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_1644 = 0;
                                                    testing::internal::EqHelper<true>::
                                                    Compare<int,int>((EqHelper<true> *)local_1640,
                                                                     "0","kPlusHaloSize",&local_1644
                                                                     ,&lPlusHaloSize);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1640
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1650);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1640);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_118.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,199,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_118.message_,
                                                             &local_1650);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_118.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1650);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1640);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_166c = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<int,int>((EqHelper<false> *)local_1668,
                                                                     "1","lPlusHaloSize",&local_166c
                                                                     ,(int *)((long)&gtest_ar_67.
                                                                                     message_.ptr_ +
                                                                             4));
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1668
                                                                      );
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_1678);
                                                      pcVar3 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_1668);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_1680,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,200,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1680,&local_1678);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1680);
                                                  testing::Message::~Message(&local_1678);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1668);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(FieldUnittest, Register)
{
    ASSERT_TRUE(ser.fieldnames().empty());
    ASSERT_EQ(0, fs_fields(&ser));

    // Register some fields with the C++ API
    ser.RegisterField("field1", "int"   , 4, 42,  1,  1, 12, 1, 1, 0, 0, 0, 0, 2, 2);
    ser.RegisterField("field2", "double", 8, 42, 28, 80,  1, 3, 3, 3, 3, 0, 1, 0, 0);

    // Register some fields with the C API
    fs_register_field(&ser, "field3", 6, "int"   , 3, 4, 42,  1, 80,  1, 3, 3, 0, 0, 0, 1, 0, 0);
    fs_register_field(&ser, "field4", 6, "double", 6, 8,  1, 28, 80, 12, 0, 0, 2, 2, 0, 0, 1, 1);

    // Check that fields exist
    ASSERT_TRUE(fs_field_exists(&ser, "field1", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field2", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field3", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field4", 6));

    ASSERT_EQ(4, ser.fieldnames().size());
    ASSERT_EQ(4, fs_fields(&ser));

    // Check fields
    const DataFieldInfo& field1 = ser.FindField("field1");
    ASSERT_EQ(std::string("field1"), field1.name());
    ASSERT_EQ(std::string("int"), field1.type());
    ASSERT_EQ(4, field1.bytesPerElement());
    ASSERT_EQ(2, field1.rank());
    ASSERT_EQ(42, field1.iSize());
    ASSERT_EQ( 1, field1.jSize());
    ASSERT_EQ( 1, field1.kSize());
    ASSERT_EQ(12, field1.lSize());
    ASSERT_EQ(1, field1.iMinusHaloSize());
    ASSERT_EQ(0, field1.jMinusHaloSize());
    ASSERT_EQ(0, field1.kMinusHaloSize());
    ASSERT_EQ(2, field1.lMinusHaloSize());
    ASSERT_EQ(1, field1.iPlusHaloSize());
    ASSERT_EQ(0, field1.jPlusHaloSize());
    ASSERT_EQ(0, field1.kPlusHaloSize());
    ASSERT_EQ(2, field1.lPlusHaloSize());

    const DataFieldInfo& field2 = ser.FindField("field2");
    ASSERT_EQ(std::string("field2"), field2.name());
    ASSERT_EQ(std::string("double"), field2.type());
    ASSERT_EQ(8, field2.bytesPerElement());
    ASSERT_EQ(3, field2.rank());
    ASSERT_EQ(42, field2.iSize());
    ASSERT_EQ(28, field2.jSize());
    ASSERT_EQ(80, field2.kSize());
    ASSERT_EQ(1, field2.lSize());
    ASSERT_EQ(3, field2.iMinusHaloSize());
    ASSERT_EQ(3, field2.jMinusHaloSize());
    ASSERT_EQ(0, field2.kMinusHaloSize());
    ASSERT_EQ(0, field2.lMinusHaloSize());
    ASSERT_EQ(3, field2.iPlusHaloSize());
    ASSERT_EQ(3, field2.jPlusHaloSize());
    ASSERT_EQ(1, field2.kPlusHaloSize());
    ASSERT_EQ(0, field2.lPlusHaloSize());

    const DataFieldInfo& field3 = ser.FindField("field3");
    ASSERT_EQ(std::string("field3"), field3.name());
    ASSERT_EQ(std::string("int"), field3.type());
    ASSERT_EQ(4, field3.bytesPerElement());
    ASSERT_EQ(2, field3.rank());
    ASSERT_EQ(42, field3.iSize());
    ASSERT_EQ( 1, field3.jSize());
    ASSERT_EQ(80, field3.kSize());
    ASSERT_EQ( 1, field3.lSize());
    ASSERT_EQ(3, field3.iMinusHaloSize());
    ASSERT_EQ(0, field3.jMinusHaloSize());
    ASSERT_EQ(0, field3.kMinusHaloSize());
    ASSERT_EQ(0, field3.lMinusHaloSize());
    ASSERT_EQ(3, field3.iPlusHaloSize());
    ASSERT_EQ(0, field3.jPlusHaloSize());
    ASSERT_EQ(1, field3.kPlusHaloSize());
    ASSERT_EQ(0, field3.lPlusHaloSize());

    const DataFieldInfo& field4 = ser.FindField("field4");
    ASSERT_EQ(std::string("field4"), field4.name());
    ASSERT_EQ(std::string("double"), field4.type());
    ASSERT_EQ(8, field4.bytesPerElement());
    ASSERT_EQ(3, field4.rank());
    ASSERT_EQ( 1, field4.iSize());
    ASSERT_EQ(28, field4.jSize());
    ASSERT_EQ(80, field4.kSize());
    ASSERT_EQ(12, field4.lSize());
    ASSERT_EQ(0, field4.iMinusHaloSize());
    ASSERT_EQ(2, field4.jMinusHaloSize());
    ASSERT_EQ(0, field4.kMinusHaloSize());
    ASSERT_EQ(1, field4.lMinusHaloSize());
    ASSERT_EQ(0, field4.iPlusHaloSize());
    ASSERT_EQ(2, field4.jPlusHaloSize());
    ASSERT_EQ(0, field4.kPlusHaloSize());
    ASSERT_EQ(1, field4.lPlusHaloSize());

    // Check with C API
    int bytesPerElement, iSize, jSize, kSize, lSize,
        iMinusHaloSize, iPlusHaloSize, jMinusHaloSize, jPlusHaloSize,
        kMinusHaloSize, kPlusHaloSize, lMinusHaloSize, lPlusHaloSize;

    fs_get_fieldinfo(&ser, "field1", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(4, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ( 1, jSize);
    ASSERT_EQ( 1, kSize);
    ASSERT_EQ(12, lSize);
    ASSERT_EQ(1, iMinusHaloSize);
    ASSERT_EQ(0, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(2, lMinusHaloSize);
    ASSERT_EQ(1, iPlusHaloSize);
    ASSERT_EQ(0, jPlusHaloSize);
    ASSERT_EQ(0, kPlusHaloSize);
    ASSERT_EQ(2, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field2", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(8, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ(28, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ(1, lSize);
    ASSERT_EQ(3, iMinusHaloSize);
    ASSERT_EQ(3, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(0, lMinusHaloSize);
    ASSERT_EQ(3, iPlusHaloSize);
    ASSERT_EQ(3, jPlusHaloSize);
    ASSERT_EQ(1, kPlusHaloSize);
    ASSERT_EQ(0, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field3", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(4, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ( 1, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ( 1, lSize);
    ASSERT_EQ(3, iMinusHaloSize);
    ASSERT_EQ(0, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(0, lMinusHaloSize);
    ASSERT_EQ(3, iPlusHaloSize);
    ASSERT_EQ(0, jPlusHaloSize);
    ASSERT_EQ(1, kPlusHaloSize);
    ASSERT_EQ(0, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field4", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(8, bytesPerElement);
    ASSERT_EQ( 1, iSize);
    ASSERT_EQ(28, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ(12, lSize);
    ASSERT_EQ(0, iMinusHaloSize);
    ASSERT_EQ(2, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(1, lMinusHaloSize);
    ASSERT_EQ(0, iPlusHaloSize);
    ASSERT_EQ(2, jPlusHaloSize);
    ASSERT_EQ(0, kPlusHaloSize);
    ASSERT_EQ(1, lPlusHaloSize);
}